

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool operator<(CService *a,CService *b)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  direct_or_indirect local_a8;
  uint local_98;
  undefined8 local_90;
  direct_or_indirect local_88;
  uint local_78;
  undefined8 local_70;
  direct_or_indirect local_68;
  uint local_58;
  undefined8 local_50;
  direct_or_indirect local_48;
  uint local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_48.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)a);
  local_30._0_4_ = (a->super_CNetAddr).m_net;
  local_30._4_4_ = (a->super_CNetAddr).m_scope_id;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_68.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)b);
  local_50._0_4_ = (b->super_CNetAddr).m_net;
  local_50._4_4_ = (b->super_CNetAddr).m_scope_id;
  bVar1 = operator<((CNetAddr *)&local_48.indirect_contents,(CNetAddr *)&local_68.indirect_contents)
  ;
  bVar2 = true;
  if (!bVar1) {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_88.indirect_contents,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)a);
    local_70._0_4_ = (a->super_CNetAddr).m_net;
    local_70._4_4_ = (a->super_CNetAddr).m_scope_id;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a8.indirect_contents,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)b);
    local_90._0_4_ = (b->super_CNetAddr).m_net;
    local_90._4_4_ = (b->super_CNetAddr).m_scope_id;
    if ((int)local_70 == (undefined4)local_90) {
      bVar2 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator==
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &local_88.indirect_contents,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &local_a8.indirect_contents);
      if (bVar2) {
        bVar2 = a->port < b->port;
        goto LAB_006ab4ec;
      }
    }
    bVar2 = false;
  }
LAB_006ab4ec:
  if (!bVar1) {
    if (0x10 < local_98) {
      free(local_a8.indirect_contents.indirect);
      local_a8.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < local_78) {
      free(local_88.indirect_contents.indirect);
      local_88.indirect_contents.indirect = (char *)0x0;
    }
  }
  if (0x10 < local_58) {
    free(local_68.indirect_contents.indirect);
    local_68.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_38) {
    free(local_48.indirect_contents.indirect);
    local_48.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const CService& a, const CService& b)
{
    return static_cast<CNetAddr>(a) < static_cast<CNetAddr>(b) || (static_cast<CNetAddr>(a) == static_cast<CNetAddr>(b) && a.port < b.port);
}